

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O1

Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readSequence_abi_cxx11_
          (Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  pointer pVVar1;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  undefined1 uVar4;
  YamlEvent event;
  Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Sequence seq;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  undefined1 local_100 [32];
  pointer local_e0;
  undefined1 local_d8 [8];
  undefined1 local_d0 [8];
  undefined1 local_c8 [16];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined1 local_b0 [48];
  bool local_80;
  vector<yaml::Value,_std::allocator<yaml::Value>_> local_78;
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  
  local_78.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = (pointer)&(__return_storage_ptr__->field_0).value_.
                       super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
LAB_0014a054:
  getNextEvent_abi_cxx11_
            ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_60,this);
  if (local_48[0x10] == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "Error while reading sequence: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    local_b0._16_8_ = local_c8._0_8_;
    _Var2._M_p = local_b0 + 0x10;
    if (local_d8 == (undefined1  [8])local_c8) {
      local_b0._24_8_ = local_c8._8_8_;
      local_b0._0_8_ = _Var2._M_p;
    }
    else {
      local_b0._0_8_ = local_d8;
    }
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_start = local_e0;
    if ((pointer)local_b0._0_8_ == _Var2._M_p) {
      *(undefined8 *)local_e0 = local_b0._16_8_;
      (local_e0->string_)._M_dataplus._M_p = (pointer)local_b0._24_8_;
    }
    else {
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_b0._0_8_;
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)local_b0._16_8_;
    }
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_d0;
    local_b0._16_8_ = local_b0._16_8_ & 0xffffffffffffff00;
    __return_storage_ptr__->has_value_ = false;
    local_b0._8_8_ = (pointer)0x0;
    local_d0 = (undefined1  [8])0x0;
    local_d8 = (undefined1  [8])local_c8;
    local_b0._0_8_ = _Var2._M_p;
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_60);
LAB_0014a489:
    std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&local_78);
    return __return_storage_ptr__;
  }
  local_d8._0_4_ = local_60._0_4_;
  if ((pointer)local_60._8_8_ == (pointer)local_48) {
    uStack_b8 = local_48._8_4_;
    uStack_b4 = local_48._12_4_;
    local_d0 = (undefined1  [8])(local_c8 + 8);
  }
  else {
    local_d0 = (undefined1  [8])local_60._8_8_;
  }
  local_c8._12_4_ = local_48._4_4_;
  local_c8._8_4_ = local_48._0_4_;
  local_c8._0_8_ = local_60._16_8_;
  local_60._16_8_ = (pointer)0x0;
  local_48._0_4_ = local_48._0_4_ & 0xffffff00;
  local_60._8_8_ = (pointer)local_48;
  switch(local_60._0_4_) {
  case 6:
    std::vector<yaml::Value,std::allocator<yaml::Value>>::emplace_back<std::__cxx11::string>
              ((vector<yaml::Value,std::allocator<yaml::Value>> *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d8 + 8));
    goto LAB_0014a268;
  case 7:
    readSequence_abi_cxx11_
              ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b0,this);
    uVar4 = local_b0[0x20];
    if ((bool)local_b0[0x20] == false) {
      pVVar1 = (pointer)(local_100 + 0x10);
      local_100._0_8_ = pVVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_b0._0_8_,(undefined1 *)(local_b0._8_8_ + local_b0._0_8_))
      ;
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_start = local_e0;
      if ((pointer)local_100._0_8_ == pVVar1) {
        *(pointer *)local_e0 = (pointer)CONCAT71(local_100._17_7_,local_100[0x10]);
        (local_e0->string_)._M_dataplus._M_p = (pointer)local_100._24_8_;
      }
      else {
        (__return_storage_ptr__->field_0).value_.
        super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_100._0_8_;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
             CONCAT71(local_100._17_7_,local_100[0x10]);
      }
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_100._8_8_;
      local_100._8_8_ = (pointer)0x0;
      local_100[0x10] = '\0';
      __return_storage_ptr__->has_value_ = false;
      local_100._0_8_ = pVVar1;
    }
    else {
      std::vector<yaml::Value,std::allocator<yaml::Value>>::
      emplace_back<std::vector<yaml::Value,std::allocator<yaml::Value>>>
                ((vector<yaml::Value,std::allocator<yaml::Value>> *)&local_78,
                 (vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_b0);
    }
    Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_b0);
    goto LAB_0014a25a;
  case 8:
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_start = local_78.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_78.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_78.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_78.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->has_value_ = true;
    break;
  case 9:
    readMapping_abi_cxx11_
              ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b0,this);
    uVar4 = local_80;
    if (local_80 == false) {
      pVVar1 = (pointer)(local_100 + 0x10);
      local_100._0_8_ = pVVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_b0._0_8_,(undefined1 *)(local_b0._8_8_ + local_b0._0_8_))
      ;
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_start = local_e0;
      if ((pointer)local_100._0_8_ == pVVar1) {
        *(pointer *)local_e0 = (pointer)CONCAT71(local_100._17_7_,local_100[0x10]);
        (local_e0->string_)._M_dataplus._M_p = (pointer)local_100._24_8_;
      }
      else {
        (__return_storage_ptr__->field_0).value_.
        super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_100._0_8_;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
             CONCAT71(local_100._17_7_,local_100[0x10]);
      }
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_100._8_8_;
      local_100._8_8_ = (pointer)0x0;
      local_100[0x10] = '\0';
      __return_storage_ptr__->has_value_ = false;
      local_100._0_8_ = pVVar1;
    }
    else {
      std::vector<yaml::Value,_std::allocator<yaml::Value>_>::emplace_back<yaml::Mapping>
                (&local_78,(Mapping *)local_b0);
    }
    Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_b0);
LAB_0014a25a:
    if (uVar4 == '\0') break;
LAB_0014a268:
    if (local_d0 != (undefined1  [8])(local_c8 + 8)) {
      operator_delete((void *)local_d0,(ulong)(local_c8._8_8_ + 1));
    }
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_60);
    goto LAB_0014a054;
  default:
    format_abi_cxx11_((string *)local_100,"Unexpected event %d");
    uVar3 = local_100._8_8_;
    _Var2._M_p = local_b0 + 0x10;
    if ((pointer)local_100._0_8_ == (pointer)(local_100 + 0x10)) {
      local_b0._24_8_ = local_100._24_8_;
      local_b0._0_8_ = _Var2._M_p;
    }
    else {
      local_b0._0_8_ = local_100._0_8_;
    }
    local_b0._17_7_ = local_100._17_7_;
    local_b0[0x10] = local_100[0x10];
    local_100._8_8_ = (pointer)0x0;
    local_100[0x10] = '\0';
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_start = local_e0;
    if ((pointer)local_b0._0_8_ == _Var2._M_p) {
      *(undefined8 *)local_e0 = local_b0._16_8_;
      (local_e0->string_)._M_dataplus._M_p = (pointer)local_b0._24_8_;
    }
    else {
      (__return_storage_ptr__->field_0).value_.
      super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_b0._0_8_;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_b0._16_8_;
    }
    (__return_storage_ptr__->field_0).value_.
    super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)uVar3;
    local_b0._8_8_ = (pointer)0x0;
    local_b0._16_8_ = (ulong)(uint7)local_100._17_7_ << 8;
    __return_storage_ptr__->has_value_ = false;
    local_100._0_8_ = (pointer)(local_100 + 0x10);
    local_b0._0_8_ = _Var2._M_p;
  }
  if (local_d0 != (undefined1  [8])(local_c8 + 8)) {
    operator_delete((void *)local_d0,(ulong)(local_c8._8_8_ + 1));
  }
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_60);
  goto LAB_0014a489;
}

Assistant:

Expected<Sequence, std::string> readSequence() {
		Sequence seq;
		for (;;) {
			auto event_result = getNextEvent();
			if (!event_result)
				return Unexpected("Error while reading sequence: " + event_result.error());
			YamlEvent event = std::move(event_result).value();

			switch (event.type) {
				case YAML_SCALAR_EVENT:
					MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
					seq.emplace_back(std::move(event.value));
					break;
				case YAML_SEQUENCE_START_EVENT:
					MSG("YAML_SEQUENCE_START_EVENT");
					{
						auto result = readSequence();
						if (!result)
							return Unexpected(result.error());
						seq.emplace_back(std::move(result).value());
					}
					break;
				case YAML_MAPPING_START_EVENT:
					MSG("YAML_MAPPING_START_EVENT");
					{
						auto result = readMapping();
						if (!result)
							return Unexpected(result.error());
						seq.emplace_back(std::move(result).value());
					}
					break;
				case YAML_SEQUENCE_END_EVENT:
					MSG("YAML_SEQUENCE_END_EVENT");
					return seq;
				default:
					return Unexpected(format("Unexpected event %d", event.type));
			}
		}
	}